

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_variable * pugi::impl::anon_unknown_0::new_xpath_variable(xpath_value_type type,char_t *name)

{
  size_t sVar1;
  xpath_variable *pxVar2;
  xpath_variable **__dest;
  
  switch(type) {
  case xpath_type_node_set:
    sVar1 = strlen(name);
    if (sVar1 == 0) {
      return (xpath_variable *)0x0;
    }
    pxVar2 = (xpath_variable *)
             (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate)
                       (sVar1 + 0x40);
    if (pxVar2 == (xpath_variable *)0x0) {
      return (xpath_variable *)0x0;
    }
    pxVar2->_type = xpath_type_node_set;
    pxVar2->_next = (xpath_variable *)0x0;
    xpath_node_set::xpath_node_set((xpath_node_set *)(pxVar2 + 1));
    __dest = &pxVar2[3]._next;
    goto LAB_0068edb7;
  case xpath_type_number:
    sVar1 = strlen(name);
    if (sVar1 == 0) {
      return (xpath_variable *)0x0;
    }
    pxVar2 = (xpath_variable *)
             (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate)
                       (sVar1 + 0x20);
    if (pxVar2 == (xpath_variable *)0x0) {
      return (xpath_variable *)0x0;
    }
    pxVar2->_type = xpath_type_number;
    break;
  case xpath_type_string:
    sVar1 = strlen(name);
    if (sVar1 == 0) {
      return (xpath_variable *)0x0;
    }
    pxVar2 = (xpath_variable *)
             (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate)
                       (sVar1 + 0x20);
    if (pxVar2 == (xpath_variable *)0x0) {
      return (xpath_variable *)0x0;
    }
    pxVar2->_type = xpath_type_string;
    break;
  case xpath_type_boolean:
    sVar1 = strlen(name);
    if (sVar1 == 0) {
      return (xpath_variable *)0x0;
    }
    pxVar2 = (xpath_variable *)
             (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate)
                       (sVar1 + 0x18);
    if (pxVar2 == (xpath_variable *)0x0) {
      return (xpath_variable *)0x0;
    }
    pxVar2->_type = xpath_type_boolean;
    pxVar2->_next = (xpath_variable *)0x0;
    *(undefined1 *)&pxVar2[1]._type = xpath_type_none;
    __dest = (xpath_variable **)((long)&pxVar2[1]._type + 1);
    goto LAB_0068edb7;
  default:
    return (xpath_variable *)0x0;
  }
  pxVar2->_next = (xpath_variable *)0x0;
  *(undefined8 *)(pxVar2 + 1) = 0;
  __dest = &pxVar2[1]._next;
LAB_0068edb7:
  memcpy(__dest,name,sVar1 + 1);
  return pxVar2;
}

Assistant:

PUGI_IMPL_FN xpath_variable* new_xpath_variable(xpath_value_type type, const char_t* name)
	{
		switch (type)
		{
		case xpath_type_node_set:
			return new_xpath_variable<xpath_variable_node_set>(name);

		case xpath_type_number:
			return new_xpath_variable<xpath_variable_number>(name);

		case xpath_type_string:
			return new_xpath_variable<xpath_variable_string>(name);

		case xpath_type_boolean:
			return new_xpath_variable<xpath_variable_boolean>(name);

		default:
			return NULL;
		}
	}